

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.c
# Opt level: O0

char * curl_version(void)

{
  undefined8 uVar1;
  size_t __n;
  size_t n;
  int j;
  int i;
  char psl_ver [30];
  char zstd_ver [30];
  char br_version [30];
  char z_version [30];
  char ssl_version [200];
  char *src [16];
  size_t outlen;
  char *outp;
  
  Curl_ssl_version(z_version + 0x18,200);
  src[0] = z_version + 0x18;
  uVar1 = zlibVersion();
  curl_msnprintf(br_version + 0x18,0x1e,"zlib/%s",uVar1);
  src[1] = br_version + 0x18;
  brotli_version(zstd_ver + 0x18,0x1e);
  src[2] = zstd_ver + 0x18;
  zstd_version(psl_ver + 0x18,0x1e);
  src[3] = psl_ver + 0x18;
  psl_version((char *)&j,0x1e);
  src[4] = (char *)&j;
  outlen = (size_t)curl_version::out;
  src[0xf] = (char *)0x12c;
  n._0_4_ = 0;
  while (((int)n < 6 && (__n = strlen(src[(long)(int)n + -1]), (char *)(__n + 2) < src[0xf]))) {
    if ((int)n != 0) {
      *(undefined1 *)outlen = 0x20;
      src[0xf] = src[0xf] + -1;
      outlen = outlen + 1;
    }
    memcpy((void *)outlen,src[(long)(int)n + -1],__n);
    outlen = __n + outlen;
    src[0xf] = src[0xf] + -__n;
    n._0_4_ = (int)n + 1;
  }
  *(undefined1 *)outlen = 0;
  return curl_version::out;
}

Assistant:

char *curl_version(void)
{
  static char out[300];
  char *outp;
  size_t outlen;
  const char *src[VERSION_PARTS];
#ifdef USE_SSL
  char ssl_version[200];
#endif
#ifdef HAVE_LIBZ
  char z_version[30];
#endif
#ifdef HAVE_BROTLI
  char br_version[30];
#endif
#ifdef HAVE_ZSTD
  char zstd_ver[30];
#endif
#ifdef USE_ARES
  char cares_version[30];
#endif
#ifdef USE_IDN
  char idn_ver[30];
#endif
#ifdef USE_LIBPSL
  char psl_ver[30];
#endif
#ifdef USE_SSH
  char ssh_version[30];
#endif
#ifdef USE_NGHTTP2
  char h2_version[30];
#endif
#ifdef USE_HTTP3
  char h3_version[30];
#endif
#ifdef USE_LIBRTMP
  char rtmp_version[30];
#endif
#ifdef USE_GSASL
  char gsasl_buf[30];
#endif
#ifdef USE_OPENLDAP
  char ldap_buf[30];
#endif
  int i = 0;
  int j;

#ifdef DEBUGBUILD
  /* Override version string when environment variable CURL_VERSION is set */
  const char *debugversion = getenv("CURL_VERSION");
  if(debugversion) {
    msnprintf(out, sizeof(out), "%s", debugversion);
    return out;
  }
#endif

  src[i++] = LIBCURL_NAME "/" LIBCURL_VERSION;
#ifdef USE_SSL
  Curl_ssl_version(ssl_version, sizeof(ssl_version));
  src[i++] = ssl_version;
#endif
#ifdef HAVE_LIBZ
  msnprintf(z_version, sizeof(z_version), "zlib/%s", zlibVersion());
  src[i++] = z_version;
#endif
#ifdef HAVE_BROTLI
  brotli_version(br_version, sizeof(br_version));
  src[i++] = br_version;
#endif
#ifdef HAVE_ZSTD
  zstd_version(zstd_ver, sizeof(zstd_ver));
  src[i++] = zstd_ver;
#endif
#ifdef USE_ARES
  msnprintf(cares_version, sizeof(cares_version),
            "c-ares/%s", ares_version(NULL));
  src[i++] = cares_version;
#endif
#ifdef USE_IDN
  idn_version(idn_ver, sizeof(idn_ver));
  src[i++] = idn_ver;
#endif
#ifdef USE_LIBPSL
  psl_version(psl_ver, sizeof(psl_ver));
  src[i++] = psl_ver;
#endif
#ifdef USE_SSH
  Curl_ssh_version(ssh_version, sizeof(ssh_version));
  src[i++] = ssh_version;
#endif
#ifdef USE_NGHTTP2
  Curl_http2_ver(h2_version, sizeof(h2_version));
  src[i++] = h2_version;
#endif
#ifdef USE_HTTP3
  Curl_quic_ver(h3_version, sizeof(h3_version));
  src[i++] = h3_version;
#endif
#ifdef USE_LIBRTMP
  Curl_rtmp_version(rtmp_version, sizeof(rtmp_version));
  src[i++] = rtmp_version;
#endif
#ifdef USE_GSASL
  msnprintf(gsasl_buf, sizeof(gsasl_buf), "libgsasl/%s",
            gsasl_check_version(NULL));
  src[i++] = gsasl_buf;
#endif
#ifdef USE_OPENLDAP
  oldap_version(ldap_buf, sizeof(ldap_buf));
  src[i++] = ldap_buf;
#endif

  DEBUGASSERT(i <= VERSION_PARTS);

  outp = &out[0];
  outlen = sizeof(out);
  for(j = 0; j < i; j++) {
    size_t n = strlen(src[j]);
    /* we need room for a space, the string and the final zero */
    if(outlen <= (n + 2))
      break;
    if(j) {
      /* prepend a space if not the first */
      *outp++ = ' ';
      outlen--;
    }
    memcpy(outp, src[j], n);
    outp += n;
    outlen -= n;
  }
  *outp = 0;

  return out;
}